

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  size_t sVar2;
  ostream *poVar3;
  pointer pSVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar1) {
      printHeaderString(this,&pSVar4->name,2);
    }
    Colour::use(None);
  }
  pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.file = pSVar4[-1].lineInfo.file;
  local_28.line = pSVar4[-1].lineInfo.line;
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001c32a0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001c32a7._0_1_ = '-';
    uRam00000000001c32a7._1_1_ = '-';
    uRam00000000001c32a7._2_1_ = '-';
    uRam00000000001c32a7._3_1_ = '-';
    uRam00000000001c32a7._4_1_ = '-';
    uRam00000000001c32a7._5_1_ = '-';
    uRam00000000001c32a7._6_1_ = '-';
    uRam00000000001c32a7._7_1_ = '-';
    DAT_001c3290 = '-';
    DAT_001c3290_1._0_1_ = '-';
    DAT_001c3290_1._1_1_ = '-';
    DAT_001c3290_1._2_1_ = '-';
    DAT_001c3290_1._3_1_ = '-';
    DAT_001c3290_1._4_1_ = '-';
    DAT_001c3290_1._5_1_ = '-';
    DAT_001c3290_1._6_1_ = '-';
    uRam00000000001c3298 = 0x2d2d2d2d2d2d2d;
    DAT_001c329f = 0x2d;
    DAT_001c3280 = '-';
    DAT_001c3280_1._0_1_ = '-';
    DAT_001c3280_1._1_1_ = '-';
    DAT_001c3280_1._2_1_ = '-';
    DAT_001c3280_1._3_1_ = '-';
    DAT_001c3280_1._4_1_ = '-';
    DAT_001c3280_1._5_1_ = '-';
    DAT_001c3280_1._6_1_ = '-';
    uRam00000000001c3288._0_1_ = '-';
    uRam00000000001c3288._1_1_ = '-';
    uRam00000000001c3288._2_1_ = '-';
    uRam00000000001c3288._3_1_ = '-';
    uRam00000000001c3288._4_1_ = '-';
    uRam00000000001c3288._5_1_ = '-';
    uRam00000000001c3288._6_1_ = '-';
    uRam00000000001c3288._7_1_ = '-';
    DAT_001c3270 = '-';
    DAT_001c3270_1._0_1_ = '-';
    DAT_001c3270_1._1_1_ = '-';
    DAT_001c3270_1._2_1_ = '-';
    DAT_001c3270_1._3_1_ = '-';
    DAT_001c3270_1._4_1_ = '-';
    DAT_001c3270_1._5_1_ = '-';
    DAT_001c3270_1._6_1_ = '-';
    uRam00000000001c3278._0_1_ = '-';
    uRam00000000001c3278._1_1_ = '-';
    uRam00000000001c3278._2_1_ = '-';
    uRam00000000001c3278._3_1_ = '-';
    uRam00000000001c3278._4_1_ = '-';
    uRam00000000001c3278._5_1_ = '-';
    uRam00000000001c3278._6_1_ = '-';
    uRam00000000001c3278._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001c3268._0_1_ = '-';
    uRam00000000001c3268._1_1_ = '-';
    uRam00000000001c3268._2_1_ = '-';
    uRam00000000001c3268._3_1_ = '-';
    uRam00000000001c3268._4_1_ = '-';
    uRam00000000001c3268._5_1_ = '-';
    uRam00000000001c3268._6_1_ = '-';
    uRam00000000001c3268._7_1_ = '-';
    DAT_001c32af = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c3340 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c3347._0_1_ = '.';
    uRam00000000001c3347._1_1_ = '.';
    uRam00000000001c3347._2_1_ = '.';
    uRam00000000001c3347._3_1_ = '.';
    uRam00000000001c3347._4_1_ = '.';
    uRam00000000001c3347._5_1_ = '.';
    uRam00000000001c3347._6_1_ = '.';
    uRam00000000001c3347._7_1_ = '.';
    DAT_001c3330 = '.';
    DAT_001c3330_1._0_1_ = '.';
    DAT_001c3330_1._1_1_ = '.';
    DAT_001c3330_1._2_1_ = '.';
    DAT_001c3330_1._3_1_ = '.';
    DAT_001c3330_1._4_1_ = '.';
    DAT_001c3330_1._5_1_ = '.';
    DAT_001c3330_1._6_1_ = '.';
    uRam00000000001c3338 = 0x2e2e2e2e2e2e2e;
    DAT_001c333f = 0x2e;
    DAT_001c3320 = '.';
    DAT_001c3320_1._0_1_ = '.';
    DAT_001c3320_1._1_1_ = '.';
    DAT_001c3320_1._2_1_ = '.';
    DAT_001c3320_1._3_1_ = '.';
    DAT_001c3320_1._4_1_ = '.';
    DAT_001c3320_1._5_1_ = '.';
    DAT_001c3320_1._6_1_ = '.';
    uRam00000000001c3328._0_1_ = '.';
    uRam00000000001c3328._1_1_ = '.';
    uRam00000000001c3328._2_1_ = '.';
    uRam00000000001c3328._3_1_ = '.';
    uRam00000000001c3328._4_1_ = '.';
    uRam00000000001c3328._5_1_ = '.';
    uRam00000000001c3328._6_1_ = '.';
    uRam00000000001c3328._7_1_ = '.';
    DAT_001c3310 = '.';
    DAT_001c3310_1._0_1_ = '.';
    DAT_001c3310_1._1_1_ = '.';
    DAT_001c3310_1._2_1_ = '.';
    DAT_001c3310_1._3_1_ = '.';
    DAT_001c3310_1._4_1_ = '.';
    DAT_001c3310_1._5_1_ = '.';
    DAT_001c3310_1._6_1_ = '.';
    uRam00000000001c3318._0_1_ = '.';
    uRam00000000001c3318._1_1_ = '.';
    uRam00000000001c3318._2_1_ = '.';
    uRam00000000001c3318._3_1_ = '.';
    uRam00000000001c3318._4_1_ = '.';
    uRam00000000001c3318._5_1_ = '.';
    uRam00000000001c3318._6_1_ = '.';
    uRam00000000001c3318._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001c3308._0_1_ = '.';
    uRam00000000001c3308._1_1_ = '.';
    uRam00000000001c3308._2_1_ = '.';
    uRam00000000001c3308._3_1_ = '.';
    uRam00000000001c3308._4_1_ = '.';
    uRam00000000001c3308._5_1_ = '.';
    uRam00000000001c3308._6_1_ = '.';
    uRam00000000001c3308._7_1_ = '.';
    DAT_001c334f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}